

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Service_Request_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Service_Request_PDU::Encode(Service_Request_PDU *this,KDataStream *stream)

{
  pointer pSVar1;
  pointer pSVar2;
  
  Logistics_Header::Encode((Logistics_Header *)this,stream);
  KDataStream::Write(stream,this->m_ui8ServiceTypeRequested);
  KDataStream::Write(stream,(this->super_Resupply_Received_PDU).m_ui8NumSupplyTypes);
  KDataStream::Write<unsigned_short>(stream,(this->super_Resupply_Received_PDU).m_ui16Padding1);
  pSVar1 = (this->super_Resupply_Received_PDU).m_vSupplies.
           super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar2 = (this->super_Resupply_Received_PDU).m_vSupplies.
                super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
    (*(pSVar2->super_EntityType).super_DataTypeBase._vptr_DataTypeBase[5])(pSVar2,stream);
  }
  return;
}

Assistant:

void Service_Request_PDU::Encode( KDataStream & stream ) const
{
    Logistics_Header::Encode( stream );
    stream << m_ui8ServiceTypeRequested
           << m_ui8NumSupplyTypes
           << m_ui16Padding1;

    vector<Supplies>::const_iterator citr = m_vSupplies.begin();
    vector<Supplies>::const_iterator citrEnd = m_vSupplies.end();

    // Add supplies to the stream
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}